

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O2

void open_via_helppath(char *name,char *dir)

{
  int iVar1;
  size_t sVar2;
  t_symbol *name_00;
  t_symbol *dir_00;
  char *dir_01;
  char *basename;
  char realname [1000];
  char dirbuf [1000];
  char newname [1000];
  
  dir_01 = "./";
  if (*dir != '\0') {
    dir_01 = dir;
  }
  strncpy(realname,name,0x3de);
  realname[0x3de] = '\0';
  sVar2 = strlen(realname);
  if ((3 < sVar2) && (iVar1 = strcmp(realname + (sVar2 - 3),".pd"), iVar1 == 0)) {
    realname[sVar2 - 3] = '\0';
  }
  strncpy(newname,realname,0x3de);
  sVar2 = strlen(realname);
  builtin_strncpy(realname + sVar2,"-help.pd",9);
  iVar1 = do_open_via_path(dir_01,realname,"",dirbuf,&basename,1000,0,
                           (pd_maininstance.pd_stuff)->st_helppath);
  if (iVar1 < 0) {
    builtin_strncpy(realname,"help-",6);
    strncat(realname,name,0x3de);
    realname[999] = '\0';
    iVar1 = do_open_via_path(dir_01,realname,"",dirbuf,&basename,1000,0,
                             (pd_maininstance.pd_stuff)->st_helppath);
    if (iVar1 < 0) {
      post("sorry, couldn\'t find help patch for \"%s\"",newname);
      return;
    }
  }
  close(iVar1);
  name_00 = gensym(basename);
  dir_00 = gensym(dirbuf);
  glob_evalfile((t_pd *)0x0,name_00,dir_00);
  return;
}

Assistant:

void open_via_helppath(const char *name, const char *dir)
{
    char realname[MAXPDSTRING], newname[MAXPDSTRING], dirbuf[MAXPDSTRING], *basename;
        /* make up a silly "dir" if none is supplied */
    const char *usedir = (*dir ? dir : "./");
    int fd;

        /* 1. "objectname-help.pd" */
    strncpy(realname, name, MAXPDSTRING-10);
    realname[MAXPDSTRING-10] = 0;
    if (strlen(realname) > 3 && !strcmp(realname+strlen(realname)-3, ".pd"))
        realname[strlen(realname)-3] = 0;
    strncpy(newname, realname, MAXPDSTRING-10);
    strcat(realname, "-help.pd");
    if ((fd = do_open_via_path(usedir, realname, "", dirbuf, &basename,
        MAXPDSTRING, 0, STUFF->st_helppath)) >= 0)
            goto gotone;

        /* 2. "help-objectname.pd" */
    strcpy(realname, "help-");
    strncat(realname, name, MAXPDSTRING-10);
    realname[MAXPDSTRING-1] = 0;
    if ((fd = do_open_via_path(usedir, realname, "", dirbuf, &basename,
        MAXPDSTRING, 0, STUFF->st_helppath)) >= 0)
            goto gotone;
    post("sorry, couldn't find help patch for \"%s\"", newname);
    return;
gotone:
    close (fd);
    glob_evalfile(0, gensym((char*)basename), gensym(dirbuf));
}